

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  ostream *poVar1;
  SocketAcceptor *this;
  pointer pAVar2;
  exception *e;
  unique_ptr<FIX::Acceptor,std::default_delete<FIX::Acceptor>> local_330 [8];
  unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_> local_328;
  unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_> acceptor;
  LogFactory local_290;
  ScreenLogFactory logFactory;
  MessageStoreFactory local_1f0;
  FileStoreFactory storeFactory;
  Application local_138;
  Application application;
  SessionSettings settings;
  allocator<char> local_39;
  string local_38 [8];
  string file;
  char **argv_local;
  int argc_local;
  
  file.field_2._8_8_ = argv;
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar1 = std::operator<<(poVar1,*(char **)file.field_2._8_8_);
    poVar1 = std::operator<<(poVar1," FILE.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
    std::allocator<char>::~allocator(&local_39);
    FIX::SessionSettings::SessionSettings((SessionSettings *)&application.m_orderID,local_38,false);
    Application::Application(&local_138);
    FIX::FileStoreFactory::FileStoreFactory
              ((FileStoreFactory *)&local_1f0,(SessionSettings *)&application.m_orderID);
    FIX::SessionSettings::SessionSettings
              ((SessionSettings *)&acceptor,(SessionSettings *)&application.m_orderID);
    FIX::ScreenLogFactory::ScreenLogFactory
              ((ScreenLogFactory *)&local_290,(SessionSettings *)&acceptor);
    FIX::SessionSettings::~SessionSettings((SessionSettings *)&acceptor);
    std::unique_ptr<FIX::Acceptor,std::default_delete<FIX::Acceptor>>::
    unique_ptr<std::default_delete<FIX::Acceptor>,void>
              ((unique_ptr<FIX::Acceptor,std::default_delete<FIX::Acceptor>> *)&local_328);
    this = (SocketAcceptor *)operator_new(0x1d0);
    FIX::SocketAcceptor::SocketAcceptor
              (this,&local_138,&local_1f0,(SessionSettings *)&application.m_orderID,&local_290);
    std::unique_ptr<FIX::Acceptor,std::default_delete<FIX::Acceptor>>::
    unique_ptr<std::default_delete<FIX::Acceptor>,void>(local_330,(pointer)this);
    std::unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_>::operator=
              (&local_328,
               (unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_> *)local_330);
    std::unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_>::~unique_ptr
              ((unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_> *)local_330);
    pAVar2 = std::unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_>::operator->
                       (&local_328);
    FIX::Acceptor::start();
    wait(pAVar2);
    pAVar2 = std::unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_>::operator->
                       (&local_328);
    FIX::Acceptor::stop(SUB81(pAVar2,0));
    std::unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_>::~unique_ptr(&local_328);
    FIX::ScreenLogFactory::~ScreenLogFactory((ScreenLogFactory *)&local_290);
    FIX::FileStoreFactory::~FileStoreFactory((FileStoreFactory *)&local_1f0);
    Application::~Application(&local_138);
    FIX::SessionSettings::~SessionSettings((SessionSettings *)&application.m_orderID);
    std::__cxx11::string::~string(local_38);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    std::cout << "usage: " << argv[0] << " FILE." << std::endl;
    return 0;
  }
  std::string file = argv[1];
#ifdef HAVE_SSL
  std::string isSSL;
  if (argc > 2) {
    isSSL.assign(argv[2]);
  }
#endif

  try {
    FIX::SessionSettings settings(file);

    Application application;
    FIX::FileStoreFactory storeFactory(settings);
    FIX::ScreenLogFactory logFactory(settings);

    std::unique_ptr<FIX::Acceptor> acceptor;
#ifdef HAVE_SSL
    if (isSSL.compare("SSL") == 0) {
      acceptor = std::unique_ptr<FIX::Acceptor>(
          new FIX::ThreadedSSLSocketAcceptor(application, storeFactory, settings, logFactory));
    } else if (isSSL.compare("SSL-ST") == 0) {
      acceptor
          = std::unique_ptr<FIX::Acceptor>(new FIX::SSLSocketAcceptor(application, storeFactory, settings, logFactory));
    } else
#endif
      acceptor
          = std::unique_ptr<FIX::Acceptor>(new FIX::SocketAcceptor(application, storeFactory, settings, logFactory));

    acceptor->start();
    wait();
    acceptor->stop();

    return 0;
  } catch (std::exception &e) {
    std::cout << e.what() << std::endl;
    return 1;
  }
}